

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall Jupiter::IRC::Client::sendNotice(Client *this,string_view dest,string_view message)

{
  pointer this_00;
  size_type sVar1;
  const_pointer __n;
  size_type sVar2;
  const_pointer pvVar3;
  int __flags;
  string local_60;
  __sv_type local_40;
  Client *local_30;
  Client *this_local;
  string_view message_local;
  string_view dest_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (Client *)message._M_len;
  message_local._M_str = (char *)dest._M_len;
  local_30 = this;
  this_00 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                      (&this->m_socket);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&message_local._M_str);
  __n = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&message_local._M_str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  string_printf_abi_cxx11_(&local_60,"NOTICE %.*s :%.*s\r\n",sVar1,__n,sVar2,pvVar3);
  __flags = (int)sVar2;
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  Socket::send(this_00,(int)local_40._M_len,local_40._M_str,(size_t)__n,__flags);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void Jupiter::IRC::Client::sendNotice(std::string_view dest, std::string_view message) {
	m_socket->send(string_printf("NOTICE %.*s :%.*s" ENDL, dest.size(), dest.data(), message.size(), message.data()));
}